

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

int phosg::rename(char *__old,char *__new)

{
  int iVar1;
  char *__old_00;
  char *__new_00;
  runtime_error *this;
  uint *puVar2;
  int error;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *new_filename_local;
  string *old_filename_local;
  
  local_18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__new;
  new_filename_local = (string *)__old;
  __old_00 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__old);
  __new_00 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             c_str(local_18);
  iVar1 = ::rename(__old_00,__new_00);
  if (iVar1 != 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::operator+(&local_b8,"can\'t rename file ",new_filename_local);
    ::std::operator+(&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8,
                     " to ");
    ::std::operator+(&local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_18);
    ::std::operator+(&local_58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78,
                     ": ");
    puVar2 = (uint *)__errno_location();
    string_for_error_abi_cxx11_(&local_e8,(phosg *)(ulong)*puVar2,error);
    ::std::operator+(&local_38,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e8)
    ;
    ::std::runtime_error::runtime_error(this,(string *)&local_38);
    __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  return 0;
}

Assistant:

void rename(const std::string& old_filename, const std::string& new_filename) {
  if (::rename(old_filename.c_str(), new_filename.c_str()) != 0) {
    throw runtime_error("can\'t rename file " + old_filename + " to " + new_filename + ": " + string_for_error(errno));
  }
}